

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

void XPMP2::SoundUpdatesDone(void)

{
  bool bMute;
  char cVar1;
  
  if (gpSndSys == (long *)0x0) {
    return;
  }
  if (DAT_002cc7af == '\x01') {
    bMute = IsPaused();
    if (bMute) {
      cVar1 = '\x01';
      if (DAT_002cc7b8 != '\0') goto LAB_00207a9c;
    }
    else {
      if (DAT_002cc7b8 == '\0') goto LAB_00207a9c;
      cVar1 = '\0';
    }
    XPMPSoundMute(bMute);
    DAT_002cc7b8 = cVar1;
  }
LAB_00207a9c:
  (**(code **)(*gpSndSys + 0x48))();
  return;
}

Assistant:

void SoundUpdatesDone ()
{
    if (!gpSndSys) return;

    // Mute-on-Pause
    if (glob.bSoundMuteOnPause) {                           // shall act automatically on Pause?
        if (IsPaused()) {                                   // XP is paused?
            if (!glob.bSoundAutoMuted) {                    // ...but not yet muted?
                XPMPSoundMute(true);                        //    -> do mute
                glob.bSoundAutoMuted = true;
            }
        } else {                                            // XP is not paused
            if (glob.bSoundAutoMuted) {                     // ...but sound is auto-muted?
                XPMPSoundMute(false);                       //    -> unmute
                glob.bSoundAutoMuted = false;
            }
        }
    }

    // Have sound system do some last updates
    gpSndSys->Update();
}